

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_oh qpdf_oh_new_real_from_double(qpdf_data qpdf,double value,int decimal_places)

{
  qpdf_oh qVar1;
  double unaff_R14;
  bool in_stack_ffffffffffffffdb;
  int in_stack_ffffffffffffffdc;
  QPDFObjectHandle local_20;
  
  QPDFObjectHandle::newReal(unaff_R14,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffdb);
  qVar1 = new_object(qpdf,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_real_from_double(qpdf_data qpdf, double value, int decimal_places)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_real_from_double");
    return new_object(qpdf, QPDFObjectHandle::newReal(value, decimal_places));
}